

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  uint uVar1;
  UInt32 *pUVar2;
  UInt32 *pUVar3;
  UInt32 *pUVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  UInt32 UVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  pUVar2 = son + _cyclicBufferPos * 2;
  pUVar4 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  uVar5 = 0;
  uVar9 = 0;
  do {
    bVar11 = cutValue == 0;
    cutValue = cutValue - 1;
    if ((bVar11) || (uVar10 = pos - curMatch, _cyclicBufferSize <= uVar10)) {
      bVar11 = false;
      *pUVar2 = 0;
      *pUVar4 = 0;
    }
    else {
      UVar8 = 0;
      if (_cyclicBufferPos < uVar10) {
        UVar8 = _cyclicBufferSize;
      }
      uVar1 = uVar9;
      if (uVar5 < uVar9) {
        uVar1 = uVar5;
      }
      uVar7 = (ulong)uVar1;
      pUVar3 = son + (UVar8 + (_cyclicBufferPos - uVar10)) * 2;
      if (cur[uVar7 - uVar10] == cur[uVar7]) {
        do {
          iVar6 = (int)uVar7;
          if (lenLimit - 1 == iVar6) goto LAB_00112a5a;
          uVar7 = (ulong)(iVar6 + 1);
        } while (cur[uVar7 - uVar10] == cur[uVar7]);
        if (lenLimit - 1 == iVar6) {
LAB_00112a5a:
          *pUVar2 = *pUVar3;
          *pUVar4 = pUVar3[1];
          bVar11 = false;
          goto LAB_00112aaa;
        }
      }
      if (cur[uVar7 - uVar10] < cur[uVar7]) {
        *pUVar2 = curMatch;
        pUVar2 = pUVar3 + 1;
        pUVar3 = pUVar4;
        pUVar4 = pUVar2;
        uVar9 = (uint)uVar7;
      }
      else {
        *pUVar4 = curMatch;
        pUVar4 = pUVar3;
        uVar5 = (uint)uVar7;
      }
      curMatch = *pUVar4;
      bVar11 = true;
      pUVar4 = pUVar3;
    }
LAB_00112aaa:
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;)
  {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
    {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return;
    }
    {
      CLzRef *pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}